

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePathCommand.cxx
# Opt level: O1

bool anon_unknown.dwarf_bcf493::HandleConvertCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  pointer pcVar2;
  NormalizeOption NVar3;
  int iVar4;
  char *pcVar5;
  size_type __rlen;
  pointer pbVar6;
  bool fmt;
  string_view separator;
  string_view value_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string_view arg;
  string value;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  paths;
  allocator<char> local_c9;
  undefined1 local_c8 [32];
  _Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false> local_a8;
  char *local_a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  undefined1 local_80 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  pointer local_38;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (((long)(args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) - 6U <
      0xfffffffffffffffe) {
    local_c8._0_8_ = local_c8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_c8,"CONVERT must be called with three or four arguments.","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_002caf0b:
    local_80._16_8_ = local_c8._16_8_;
    local_80._0_8_ = local_c8._0_8_;
    if ((pointer)local_c8._0_8_ == (pointer)(local_c8 + 0x10)) {
      return false;
    }
  }
  else {
    pcVar2 = pbVar1[2]._M_dataplus._M_p;
    pbVar6 = (pointer)pbVar1[2]._M_string_length;
    if (pbVar6 == (pointer)0x13) {
      iVar4 = bcmp(pcVar2,"TO_NATIVE_PATH_LIST",0x13);
joined_r0x002caf6e:
      if (iVar4 == 0) {
        if (pbVar1[3]._M_string_length == 0) {
          local_c8._0_8_ = local_c8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_c8,"Invalid name for output variable.","");
          std::__cxx11::string::_M_assign((string *)&status->Error);
        }
        else {
          if (((anonymous_namespace)::
               HandleConvertCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
               ::parser == '\0') &&
             (iVar4 = __cxa_guard_acquire(&(anonymous_namespace)::
                                           HandleConvertCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                           ::parser), iVar4 != 0)) {
            NormalizeParser::NormalizeParser(&HandleConvertCommand::parser);
            __cxa_atexit(CMakePathArgumentParser<(anonymous_namespace)::NormalizeOption>::
                         ~CMakePathArgumentParser,&HandleConvertCommand::parser,&__dso_handle);
            __cxa_guard_release(&(anonymous_namespace)::
                                 HandleConvertCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                 ::parser);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::_M_erase_at_end(&HandleConvertCommand::parser.
                             super_CMakePathArgumentParser<(anonymous_namespace)::NormalizeOption>.
                             Inputs,HandleConvertCommand::parser.
                                    super_CMakePathArgumentParser<(anonymous_namespace)::NormalizeOption>
                                    .Inputs.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
          local_c8._8_8_ =
               (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
          local_c8._0_8_ =
               (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + 4;
          NVar3 = cmArgumentParser<(anonymous_namespace)::NormalizeOption>::
                  Parse<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                            ((cmArgumentParser<(anonymous_namespace)::NormalizeOption> *)
                             &HandleConvertCommand::parser,
                             (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              *)local_c8,
                             &HandleConvertCommand::parser.
                              super_CMakePathArgumentParser<(anonymous_namespace)::NormalizeOption>.
                              Inputs,local_c8._8_8_);
          if (HandleConvertCommand::parser.
              super_CMakePathArgumentParser<(anonymous_namespace)::NormalizeOption>.Inputs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              HandleConvertCommand::parser.
              super_CMakePathArgumentParser<(anonymous_namespace)::NormalizeOption>.Inputs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            local_98.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_98.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_98.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            if ((pbVar1[2]._M_string_length == 0x12) &&
               (iVar4 = bcmp(pbVar1[2]._M_dataplus._M_p,"TO_CMAKE_PATH_LIST",0x12), iVar4 == 0)) {
              cmsys::SystemTools::SplitString
                        ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_80,
                         (args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start + 1,':',false);
              local_c8._16_8_ =
                   local_98.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
              local_c8._8_8_ =
                   local_98.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              local_c8._0_8_ =
                   local_98.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              local_98.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)local_80._0_8_;
              local_98.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_80._8_8_;
              local_98.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_80._16_8_;
              local_80._0_8_ = (pointer)0x0;
              local_80._8_8_ = (pointer)0x0;
              local_80._16_8_ = 0;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_c8);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_80);
            }
            else {
              pbVar6 = (args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              arg._M_str = pbVar6[1]._M_dataplus._M_p;
              arg._M_len = pbVar6[1]._M_string_length;
              cmExpandList(arg,&local_98,false);
            }
            local_38 = local_98.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            if (local_98.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start !=
                local_98.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              pbVar6 = local_98.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              do {
                local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
                pcVar2 = (pbVar6->_M_dataplus)._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_58,pcVar2,pcVar2 + pbVar6->_M_string_length);
                fmt = true;
                if (pbVar1[2]._M_string_length == 0x12) {
                  iVar4 = bcmp(pbVar1[2]._M_dataplus._M_p,"TO_CMAKE_PATH_LIST",0x12);
                  fmt = iVar4 != 0;
                }
                cmCMakePath::cmCMakePath<std::__cxx11::string,cmCMakePath&>
                          ((cmCMakePath *)local_c8,&local_58,fmt);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_58._M_dataplus._M_p != &local_58.field_2) {
                  operator_delete(local_58._M_dataplus._M_p,
                                  local_58.field_2._M_allocated_capacity + 1);
                }
                if ((NVar3.Normalize & 1U) != 0) {
                  cmCMakePath::Normal((cmCMakePath *)local_80,(cmCMakePath *)local_c8);
                  cmCMakePath::operator=((cmCMakePath *)local_c8,(cmCMakePath *)local_80);
                  std::filesystem::__cxx11::path::~path((path *)local_80);
                }
                if ((pbVar1[2]._M_string_length == 0x12) &&
                   (iVar4 = bcmp(pbVar1[2]._M_dataplus._M_p,"TO_CMAKE_PATH_LIST",0x12), iVar4 == 0))
                {
                  std::filesystem::__cxx11::path::
                  generic_string<char,std::char_traits<char>,std::allocator<char>>
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_80,(path *)local_c8,&local_c9);
                }
                else {
                  cmCMakePath::NativeString_abi_cxx11_((string *)local_80,(cmCMakePath *)local_c8);
                }
                std::__cxx11::string::operator=((string *)pbVar6,(string *)local_80);
                if ((pointer)local_80._0_8_ != (pointer)(local_80 + 0x10)) {
                  operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
                }
                std::filesystem::__cxx11::path::~path((path *)local_c8);
                pbVar6 = pbVar6 + 1;
              } while (pbVar6 != local_38);
            }
            if ((pbVar1[2]._M_string_length == 0x12) &&
               (iVar4 = bcmp(pbVar1[2]._M_dataplus._M_p,"TO_CMAKE_PATH_LIST",0x12), iVar4 == 0)) {
              pcVar5 = ";";
            }
            else {
              pcVar5 = ":";
            }
            separator._M_str = pcVar5;
            separator._M_len = 1;
            cmJoin((string *)local_c8,&local_98,separator,(string_view)ZEXT816(0));
            value_00._M_str = (char *)local_c8._0_8_;
            value_00._M_len = local_c8._8_8_;
            cmMakefile::AddDefinition
                      (status->Makefile,
                       (args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + 3,value_00);
            if ((pointer)local_c8._0_8_ != (pointer)(local_c8 + 0x10)) {
              operator_delete((void *)local_c8._0_8_,(ulong)(local_c8._16_8_ + 1));
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_98);
            return true;
          }
          local_c8._0_8_ = local_c8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_c8,"CONVERT called with unexpected arguments.","");
          std::__cxx11::string::_M_assign((string *)&status->Error);
        }
        goto LAB_002caf0b;
      }
    }
    else if (pbVar6 == (pointer)0x12) {
      iVar4 = bcmp(pcVar2,"TO_CMAKE_PATH_LIST",0x12);
      goto joined_r0x002caf6e;
    }
    local_c8._0_8_ = &DAT_00000027;
    local_c8._8_8_ = "CONVERT called with an unknown action: ";
    local_a8._M_head_impl = (_Impl *)0x1;
    local_a0 = ".";
    views._M_len = 3;
    views._M_array = (iterator)local_c8;
    local_c8._16_8_ = pbVar6;
    local_c8._24_8_ = pcVar2;
    cmCatViews_abi_cxx11_((string *)local_80,views);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((pointer)local_80._0_8_ == (pointer)(local_80 + 0x10)) {
      return false;
    }
  }
  operator_delete((void *)local_80._0_8_,
                  (ulong)((long)&(((pointer)local_80._16_8_)->_M_dataplus)._M_p + 1));
  return false;
}

Assistant:

bool HandleConvertCommand(std::vector<std::string> const& args,
                          cmExecutionStatus& status)
{
#if defined(_WIN32) && !defined(__CYGWIN__)
  const auto pathSep = ";"_s;
#else
  const auto pathSep = ":"_s;
#endif
  const auto cmakePath = "TO_CMAKE_PATH_LIST"_s;
  const auto nativePath = "TO_NATIVE_PATH_LIST"_s;

  if (args.size() < 4 || args.size() > 5) {
    status.SetError("CONVERT must be called with three or four arguments.");
    return false;
  }

  const auto& action = args[2];

  if (action != cmakePath && action != nativePath) {
    status.SetError(
      cmStrCat("CONVERT called with an unknown action: ", action, "."));
    return false;
  }

  if (args[3].empty()) {
    status.SetError("Invalid name for output variable.");
    return false;
  }

  static NormalizeParser const parser;

  const auto arguments = parser.Parse<4>(args);

  if (!parser.GetInputs().empty()) {
    status.SetError("CONVERT called with unexpected arguments.");
    return false;
  }

  std::vector<std::string> paths;

  if (action == cmakePath) {
    paths = cmSystemTools::SplitString(args[1], pathSep.front());
  } else {
    cmExpandList(args[1], paths);
  }

  for (auto& path : paths) {
    auto p = cmCMakePath(path,
                         action == cmakePath ? cmCMakePath::native_format
                                             : cmCMakePath::generic_format);
    if (arguments.Normalize) {
      p = p.Normal();
    }
    if (action == cmakePath) {
      path = p.GenericString();
    } else {
      path = p.NativeString();
    }
  }

  auto value = cmJoin(paths, action == cmakePath ? ";"_s : pathSep);
  status.GetMakefile().AddDefinition(args[3], value);

  return true;
}